

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  long lVar4;
  undefined8 *puVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  Geometry *pGVar19;
  RTCIntersectArguments *pRVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  ulong uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  byte bVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar33;
  uint uVar34;
  undefined1 (*pauVar35) [32];
  long lVar36;
  ulong uVar37;
  byte bVar38;
  byte bVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  size_t sVar43;
  undefined1 (*pauVar44) [32];
  ulong uVar45;
  bool bVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined4 uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  long lStack_2600;
  UVIdentity<4> mapUV;
  int local_25c4;
  StackItemT<embree::NodeRefPtr<8>_> *local_25c0;
  ulong local_25b8;
  long local_25b0;
  long local_25a8;
  Scene *local_25a0;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2538;
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  UVIdentity<4> *local_24d8;
  byte local_24d0;
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  float local_2478 [4];
  undefined1 local_2468 [32];
  undefined1 local_2448 [32];
  undefined1 local_2428 [32];
  undefined1 local_2408 [32];
  undefined1 local_23e8 [32];
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float fVar2;
  float fVar3;
  undefined1 auVar75 [32];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_25c0 = stack + 1;
    stack[0].dist = 0;
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar50 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar69 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar48._8_4_ = 0x7fffffff;
    auVar48._0_8_ = 0x7fffffff7fffffff;
    auVar48._12_4_ = 0x7fffffff;
    auVar48 = vandps_avx512vl((undefined1  [16])aVar6,auVar48);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
    auVar100 = ZEXT1664(auVar49);
    uVar37 = vcmpps_avx512vl(auVar48,auVar49,1);
    bVar46 = (bool)((byte)uVar37 & 1);
    auVar65._0_4_ = (uint)bVar46 * auVar49._0_4_ | (uint)!bVar46 * (int)aVar6.x;
    bVar46 = (bool)((byte)(uVar37 >> 1) & 1);
    auVar65._4_4_ = (uint)bVar46 * auVar49._4_4_ | (uint)!bVar46 * (int)aVar6.y;
    bVar46 = (bool)((byte)(uVar37 >> 2) & 1);
    auVar65._8_4_ = (uint)bVar46 * auVar49._8_4_ | (uint)!bVar46 * (int)aVar6.z;
    bVar46 = (bool)((byte)(uVar37 >> 3) & 1);
    auVar65._12_4_ = (uint)bVar46 * auVar49._12_4_ | (uint)!bVar46 * aVar6.field_3.a;
    auVar48 = vrcp14ps_avx512vl(auVar65);
    auVar49._8_4_ = 0x3f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    auVar49._12_4_ = 0x3f800000;
    auVar49 = vfnmadd213ps_avx512vl(auVar65,auVar48,auVar49);
    auVar65 = vfmadd132ps_fma(auVar49,auVar48,auVar48);
    local_23e8 = vbroadcastss_avx512vl(auVar65);
    auVar101 = ZEXT3264(local_23e8);
    auVar48 = vmovshdup_avx(auVar65);
    local_2408 = vbroadcastsd_avx512vl(auVar48);
    auVar102 = ZEXT3264(local_2408);
    auVar74._8_4_ = 2;
    auVar74._0_8_ = 0x200000002;
    auVar74._12_4_ = 2;
    auVar74._16_4_ = 2;
    auVar74._20_4_ = 2;
    auVar74._24_4_ = 2;
    auVar74._28_4_ = 2;
    auVar49 = vshufpd_avx(auVar65,auVar65,1);
    local_2428 = vpermps_avx512vl(auVar74,ZEXT1632(auVar65));
    auVar103 = ZEXT3264(local_2428);
    fVar80 = auVar65._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar71._8_4_ = 1;
    auVar71._0_8_ = 0x100000001;
    auVar71._12_4_ = 1;
    auVar71._16_4_ = 1;
    auVar71._20_4_ = 1;
    auVar71._24_4_ = 1;
    auVar71._28_4_ = 1;
    auVar75._4_4_ = fVar80;
    auVar75._0_4_ = fVar80;
    auVar75._8_4_ = fVar80;
    auVar75._12_4_ = fVar80;
    auVar75._16_4_ = fVar80;
    auVar75._20_4_ = fVar80;
    auVar75._24_4_ = fVar80;
    auVar75._28_4_ = fVar80;
    auVar72 = ZEXT1632(CONCAT412(auVar65._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar65._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar65._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar80))
                                ));
    auVar71 = vpermps_avx2(auVar71,auVar72);
    auVar72 = vpermps_avx2(auVar74,auVar72);
    uVar42 = (ulong)(auVar65._0_4_ < 0.0) * 8;
    uVar37 = (ulong)(auVar48._0_4_ < 0.0) * 8 + 0x10;
    lVar4 = (ulong)(auVar49._0_4_ < 0.0) * 8;
    uVar87 = auVar69._0_4_;
    auVar83 = ZEXT3264(CONCAT428(uVar87,CONCAT424(uVar87,CONCAT420(uVar87,CONCAT416(uVar87,CONCAT412
                                                  (uVar87,CONCAT48(uVar87,CONCAT44(uVar87,uVar87))))
                                                  ))));
    uVar40 = uVar37 ^ 8;
    auVar73._8_4_ = 0x80000000;
    auVar73._0_8_ = 0x8000000080000000;
    auVar73._12_4_ = 0x80000000;
    auVar73._16_4_ = 0x80000000;
    auVar73._20_4_ = 0x80000000;
    auVar73._24_4_ = 0x80000000;
    auVar73._28_4_ = 0x80000000;
    local_2448 = vxorps_avx512vl(auVar75,auVar73);
    auVar104 = ZEXT3264(local_2448);
    local_2468 = vxorps_avx512vl(auVar71,auVar73);
    auVar105 = ZEXT3264(local_2468);
    local_2398._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
    local_2398._8_4_ = auVar72._8_4_ ^ 0x80000000;
    local_2398._12_4_ = auVar72._12_4_ ^ 0x80000000;
    local_2398._16_4_ = auVar72._16_4_ ^ 0x80000000;
    local_2398._20_4_ = auVar72._20_4_ ^ 0x80000000;
    local_2398._24_4_ = auVar72._24_4_ ^ 0x80000000;
    local_2398._28_4_ = auVar72._28_4_ ^ 0x80000000;
    auVar96 = ZEXT3264(local_2398);
    uVar87 = auVar50._0_4_;
    local_23b8._4_4_ = uVar87;
    local_23b8._0_4_ = uVar87;
    local_23b8._8_4_ = uVar87;
    local_23b8._12_4_ = uVar87;
    local_23b8._16_4_ = uVar87;
    local_23b8._20_4_ = uVar87;
    local_23b8._24_4_ = uVar87;
    local_23b8._28_4_ = uVar87;
    auVar97 = ZEXT3264(local_23b8);
    auVar71 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar98 = ZEXT3264(auVar71);
    auVar99 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    local_25b8 = uVar37;
LAB_01c744e3:
    if (local_25c0 != stack) {
      pSVar33 = local_25c0 + -1;
      local_25c0 = local_25c0 + -1;
      if ((float)pSVar33->dist <= (ray->super_RayK<1>).tfar) {
        sVar43 = (local_25c0->ptr).ptr;
LAB_01c74509:
        do {
          if ((sVar43 & 8) != 0) goto LAB_01c748fc;
          pauVar44 = (undefined1 (*) [32])(sVar43 & 0xfffffffffffffff0);
          pauVar35 = pauVar44 + 2;
          if (pauVar44 == (undefined1 (*) [32])0x0) {
            pauVar35 = (undefined1 (*) [32])0x0;
          }
          auVar84._8_8_ = 0;
          auVar84._0_8_ = *(ulong *)*pauVar35;
          auVar88._8_8_ = 0;
          auVar88._0_8_ = *(ulong *)(*pauVar35 + 8);
          uVar45 = vpcmpub_avx512vl(auVar84,auVar88,2);
          uVar87 = *(undefined4 *)(pauVar35[1] + 0x10);
          auVar72._4_4_ = uVar87;
          auVar72._0_4_ = uVar87;
          auVar72._8_4_ = uVar87;
          auVar72._12_4_ = uVar87;
          auVar72._16_4_ = uVar87;
          auVar72._20_4_ = uVar87;
          auVar72._24_4_ = uVar87;
          auVar72._28_4_ = uVar87;
          uVar87 = *(undefined4 *)(pauVar35[1] + 0x1c);
          auVar79._4_4_ = uVar87;
          auVar79._0_4_ = uVar87;
          auVar79._8_4_ = uVar87;
          auVar79._12_4_ = uVar87;
          auVar79._16_4_ = uVar87;
          auVar79._20_4_ = uVar87;
          auVar79._24_4_ = uVar87;
          auVar79._28_4_ = uVar87;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)(*pauVar35 + uVar42);
          auVar71 = vpmovzxbd_avx2(auVar8);
          auVar71 = vcvtdq2ps_avx(auVar71);
          auVar50 = vfmadd213ps_fma(auVar71,auVar79,auVar72);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(*pauVar35 + (uVar42 ^ 8));
          auVar71 = vpmovzxbd_avx2(auVar9);
          auVar71 = vcvtdq2ps_avx(auVar71);
          auVar69 = vfmadd213ps_fma(auVar71,auVar79,auVar72);
          uVar87 = *(undefined4 *)(pauVar35[1] + 0x14);
          auVar77._4_4_ = uVar87;
          auVar77._0_4_ = uVar87;
          auVar77._8_4_ = uVar87;
          auVar77._12_4_ = uVar87;
          auVar77._16_4_ = uVar87;
          auVar77._20_4_ = uVar87;
          auVar77._24_4_ = uVar87;
          auVar77._28_4_ = uVar87;
          uVar87 = *(undefined4 *)pauVar35[2];
          auVar78._4_4_ = uVar87;
          auVar78._0_4_ = uVar87;
          auVar78._8_4_ = uVar87;
          auVar78._12_4_ = uVar87;
          auVar78._16_4_ = uVar87;
          auVar78._20_4_ = uVar87;
          auVar78._24_4_ = uVar87;
          auVar78._28_4_ = uVar87;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(*pauVar35 + uVar37);
          auVar71 = vpmovzxbd_avx2(auVar10);
          auVar71 = vcvtdq2ps_avx(auVar71);
          auVar48 = vfmadd213ps_fma(auVar71,auVar78,auVar77);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(*pauVar35 + uVar40);
          auVar71 = vpmovzxbd_avx2(auVar11);
          auVar71 = vcvtdq2ps_avx(auVar71);
          auVar49 = vfmadd213ps_fma(auVar71,auVar78,auVar77);
          uVar87 = *(undefined4 *)(pauVar35[1] + 0x18);
          auVar86._4_4_ = uVar87;
          auVar86._0_4_ = uVar87;
          auVar86._8_4_ = uVar87;
          auVar86._12_4_ = uVar87;
          auVar86._16_4_ = uVar87;
          auVar86._20_4_ = uVar87;
          auVar86._24_4_ = uVar87;
          auVar86._28_4_ = uVar87;
          uVar87 = *(undefined4 *)(pauVar35[2] + 4);
          auVar89._4_4_ = uVar87;
          auVar89._0_4_ = uVar87;
          auVar89._8_4_ = uVar87;
          auVar89._12_4_ = uVar87;
          auVar89._16_4_ = uVar87;
          auVar89._20_4_ = uVar87;
          auVar89._24_4_ = uVar87;
          auVar89._28_4_ = uVar87;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)(pauVar35[1] + lVar4);
          auVar71 = vpmovzxbd_avx2(auVar12);
          auVar71 = vcvtdq2ps_avx(auVar71);
          auVar65 = vfmadd213ps_fma(auVar71,auVar89,auVar86);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)(*pauVar35 + (lVar4 + 0x20U ^ 8));
          auVar71 = vpmovzxbd_avx2(auVar13);
          auVar71 = vcvtdq2ps_avx(auVar71);
          auVar53 = vfmadd213ps_fma(auVar71,auVar89,auVar86);
          auVar71 = vfmadd213ps_avx512vl(ZEXT1632(auVar50),auVar101._0_32_,auVar104._0_32_);
          auVar72 = vfmadd213ps_avx512vl(ZEXT1632(auVar48),auVar102._0_32_,auVar105._0_32_);
          auVar71 = vpmaxsd_avx2(auVar71,auVar72);
          auVar72 = vfmadd213ps_avx512vl(ZEXT1632(auVar65),auVar103._0_32_,auVar96._0_32_);
          auVar72 = vpmaxsd_avx2(auVar72,auVar97._0_32_);
          auVar71 = vpmaxsd_avx2(auVar71,auVar72);
          auVar72 = vfmadd213ps_avx512vl(ZEXT1632(auVar69),auVar101._0_32_,auVar104._0_32_);
          auVar73 = vfmadd213ps_avx512vl(ZEXT1632(auVar49),auVar102._0_32_,auVar105._0_32_);
          auVar72 = vpminsd_avx2(auVar72,auVar73);
          auVar73 = vfmadd213ps_avx512vl(ZEXT1632(auVar53),auVar103._0_32_,auVar96._0_32_);
          auVar73 = vpminsd_avx2(auVar73,auVar83._0_32_);
          auVar72 = vpminsd_avx2(auVar72,auVar73);
          uVar47 = vpcmpd_avx512vl(auVar71,auVar72,2);
          uVar47 = uVar45 & 0xff & uVar47;
          bVar38 = (byte)uVar47;
          if (bVar38 == 0) break;
          auVar72 = *pauVar44;
          auVar73 = pauVar44[1];
          auVar74 = vpternlogd_avx512vl(auVar98._0_32_,auVar71,auVar99._0_32_,0xf8);
          auVar75 = vpcompressd_avx512vl(auVar74);
          auVar76._0_4_ =
               (uint)(bVar38 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar38 & 1) * auVar74._0_4_;
          bVar46 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar76._4_4_ = (uint)bVar46 * auVar75._4_4_ | (uint)!bVar46 * auVar74._4_4_;
          bVar46 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar76._8_4_ = (uint)bVar46 * auVar75._8_4_ | (uint)!bVar46 * auVar74._8_4_;
          bVar46 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar76._12_4_ = (uint)bVar46 * auVar75._12_4_ | (uint)!bVar46 * auVar74._12_4_;
          bVar46 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar76._16_4_ = (uint)bVar46 * auVar75._16_4_ | (uint)!bVar46 * auVar74._16_4_;
          bVar46 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar76._20_4_ = (uint)bVar46 * auVar75._20_4_ | (uint)!bVar46 * auVar74._20_4_;
          bVar46 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar76._24_4_ = (uint)bVar46 * auVar75._24_4_ | (uint)!bVar46 * auVar74._24_4_;
          bVar46 = SUB81(uVar47 >> 7,0);
          auVar76._28_4_ = (uint)bVar46 * auVar75._28_4_ | (uint)!bVar46 * auVar74._28_4_;
          auVar74 = vpermt2q_avx512vl(auVar72,auVar76,auVar73);
          sVar43 = auVar74._0_8_;
          bVar38 = bVar38 - 1 & bVar38;
          if (bVar38 != 0) {
            auVar74 = vpshufd_avx2(auVar76,0x55);
            vpermt2q_avx512vl(auVar72,auVar74,auVar73);
            auVar75 = vpminsd_avx2(auVar76,auVar74);
            auVar74 = vpmaxsd_avx2(auVar76,auVar74);
            bVar38 = bVar38 - 1 & bVar38;
            if (bVar38 == 0) {
              auVar75 = vpermi2q_avx512vl(auVar75,auVar72,auVar73);
              sVar43 = auVar75._0_8_;
              auVar72 = vpermt2q_avx512vl(auVar72,auVar74,auVar73);
              (local_25c0->ptr).ptr = auVar72._0_8_;
              lVar36 = 8;
              lStack_2600 = 0x10;
            }
            else {
              auVar86 = vpshufd_avx2(auVar76,0xaa);
              vpermt2q_avx512vl(auVar72,auVar86,auVar73);
              auVar77 = vpminsd_avx2(auVar75,auVar86);
              auVar75 = vpmaxsd_avx2(auVar75,auVar86);
              auVar86 = vpminsd_avx2(auVar74,auVar75);
              auVar75 = vpmaxsd_avx2(auVar74,auVar75);
              bVar38 = bVar38 - 1 & bVar38;
              if (bVar38 == 0) {
                auVar74 = vpermi2q_avx512vl(auVar77,auVar72,auVar73);
                sVar43 = auVar74._0_8_;
                auVar74 = vpermt2q_avx512vl(auVar72,auVar75,auVar73);
                (local_25c0->ptr).ptr = auVar74._0_8_;
                auVar74 = vpermd_avx2(auVar75,auVar71);
                local_25c0->dist = auVar74._0_4_;
                auVar72 = vpermt2q_avx512vl(auVar72,auVar86,auVar73);
                local_25c0[1].ptr.ptr = auVar72._0_8_;
                lStack_2600 = 0x18;
                lVar36 = lStack_2600;
                lStack_2600 = 0x20;
                auVar74 = auVar86;
              }
              else {
                auVar74 = vpshufd_avx2(auVar76,0xff);
                vpermt2q_avx512vl(auVar72,auVar74,auVar73);
                auVar79 = vpminsd_avx2(auVar77,auVar74);
                auVar77 = vpmaxsd_avx2(auVar77,auVar74);
                auVar74 = vpminsd_avx2(auVar86,auVar77);
                auVar77 = vpmaxsd_avx2(auVar86,auVar77);
                auVar86 = vpminsd_avx2(auVar75,auVar77);
                auVar75 = vpmaxsd_avx2(auVar75,auVar77);
                bVar38 = bVar38 - 1 & bVar38;
                if (bVar38 != 0) {
                  auVar78 = valignd_avx512vl(auVar76,auVar76,3);
                  auVar77 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar79 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar77,auVar79);
                  auVar77 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar74 = vpermt2d_avx512vl(auVar79,auVar77,auVar74);
                  auVar77 = vpermt2d_avx512vl(auVar74,auVar77,auVar86);
                  auVar74 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar74 = vpermt2d_avx512vl(auVar77,auVar74,auVar75);
                  auVar100 = ZEXT3264(auVar74);
                  bVar39 = bVar38;
                  do {
                    auVar75 = auVar100._0_32_;
                    auVar93._8_4_ = 1;
                    auVar93._0_8_ = 0x100000001;
                    auVar93._12_4_ = 1;
                    auVar93._16_4_ = 1;
                    auVar93._20_4_ = 1;
                    auVar93._24_4_ = 1;
                    auVar93._28_4_ = 1;
                    auVar74 = vpermd_avx2(auVar93,auVar78);
                    auVar78 = valignd_avx512vl(auVar78,auVar78,1);
                    vpermt2q_avx512vl(auVar72,auVar78,auVar73);
                    bVar39 = bVar39 - 1 & bVar39;
                    uVar29 = vpcmpd_avx512vl(auVar74,auVar75,5);
                    auVar74 = vpmaxsd_avx2(auVar74,auVar75);
                    bVar30 = (byte)uVar29 << 1;
                    auVar75 = valignd_avx512vl(auVar75,auVar75,7);
                    bVar46 = (bool)((byte)uVar29 & 1);
                    bVar21 = (bool)(bVar30 >> 2 & 1);
                    bVar22 = (bool)(bVar30 >> 3 & 1);
                    bVar23 = (bool)(bVar30 >> 4 & 1);
                    bVar24 = (bool)(bVar30 >> 5 & 1);
                    bVar25 = (bool)(bVar30 >> 6 & 1);
                    auVar100 = ZEXT3264(CONCAT428((uint)(bVar30 >> 7) * auVar75._28_4_ |
                                                  (uint)!(bool)(bVar30 >> 7) * auVar74._28_4_,
                                                  CONCAT424((uint)bVar25 * auVar75._24_4_ |
                                                            (uint)!bVar25 * auVar74._24_4_,
                                                            CONCAT420((uint)bVar24 * auVar75._20_4_
                                                                      | (uint)!bVar24 *
                                                                        auVar74._20_4_,
                                                                      CONCAT416((uint)bVar23 *
                                                                                auVar75._16_4_ |
                                                                                (uint)!bVar23 *
                                                                                auVar74._16_4_,
                                                                                CONCAT412((uint)
                                                  bVar22 * auVar75._12_4_ |
                                                  (uint)!bVar22 * auVar74._12_4_,
                                                  CONCAT48((uint)bVar21 * auVar75._8_4_ |
                                                           (uint)!bVar21 * auVar74._8_4_,
                                                           CONCAT44((uint)bVar46 * auVar75._4_4_ |
                                                                    (uint)!bVar46 * auVar74._4_4_,
                                                                    auVar74._0_4_))))))));
                  } while (bVar39 != 0);
                  lVar36 = (ulong)(uint)POPCOUNT((uint)bVar38) + 3;
                  while( true ) {
                    auVar75 = auVar100._0_32_;
                    auVar74 = vpermt2q_avx512vl(auVar72,auVar75,auVar73);
                    sVar43 = auVar74._0_8_;
                    bVar46 = lVar36 == 0;
                    lVar36 = lVar36 + -1;
                    if (bVar46) break;
                    (local_25c0->ptr).ptr = sVar43;
                    auVar74 = vpermd_avx2(auVar75,auVar71);
                    local_25c0->dist = auVar74._0_4_;
                    auVar74 = valignd_avx512vl(auVar75,auVar75,1);
                    auVar100 = ZEXT3264(auVar74);
                    local_25c0 = local_25c0 + 1;
                  }
                  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar100 = ZEXT1664(auVar50);
                  auVar101 = ZEXT3264(local_23e8);
                  auVar102 = ZEXT3264(local_2408);
                  auVar103 = ZEXT3264(local_2428);
                  auVar104 = ZEXT3264(local_2448);
                  auVar105 = ZEXT3264(local_2468);
                  goto LAB_01c74509;
                }
                auVar77 = vpermi2q_avx512vl(auVar79,auVar72,auVar73);
                sVar43 = auVar77._0_8_;
                auVar77 = vpermt2q_avx512vl(auVar72,auVar75,auVar73);
                (local_25c0->ptr).ptr = auVar77._0_8_;
                auVar75 = vpermd_avx2(auVar75,auVar71);
                local_25c0->dist = auVar75._0_4_;
                auVar75 = vpermt2q_avx512vl(auVar72,auVar86,auVar73);
                local_25c0[1].ptr.ptr = auVar75._0_8_;
                auVar75 = vpermd_avx2(auVar86,auVar71);
                local_25c0[1].dist = auVar75._0_4_;
                auVar72 = vpermt2q_avx512vl(auVar72,auVar74,auVar73);
                local_25c0[2].ptr.ptr = auVar72._0_8_;
                lVar36 = 0x28;
                lStack_2600 = 0x30;
              }
            }
            auVar71 = vpermd_avx2(auVar74,auVar71);
            *(int *)((long)&(local_25c0->ptr).ptr + lVar36) = auVar71._0_4_;
            local_25c0 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_25c0->ptr).ptr + lStack_2600);
          }
        } while( true );
      }
      goto LAB_01c744e3;
    }
  }
  return;
LAB_01c748fc:
  local_25b0 = (ulong)((uint)sVar43 & 0xf) - 8;
  uVar45 = sVar43 & 0xfffffffffffffff0;
  for (local_25a8 = 0; local_25a8 != local_25b0; local_25a8 = local_25a8 + 1) {
    lVar36 = local_25a8 * 0x50;
    local_25a0 = context->scene;
    ppfVar14 = (context->scene->vertices).items;
    pfVar15 = ppfVar14[*(uint *)(uVar45 + 0x30 + lVar36)];
    pfVar16 = ppfVar14[*(uint *)(uVar45 + 0x34 + lVar36)];
    pfVar17 = ppfVar14[*(uint *)(uVar45 + 0x38 + lVar36)];
    pfVar18 = ppfVar14[*(uint *)(uVar45 + 0x3c + lVar36)];
    auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar45 + lVar36)),
                            *(undefined1 (*) [16])(pfVar17 + *(uint *)(uVar45 + 8 + lVar36)));
    auVar50 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar45 + lVar36)),
                            *(undefined1 (*) [16])(pfVar17 + *(uint *)(uVar45 + 8 + lVar36)));
    auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar16 + *(uint *)(uVar45 + 4 + lVar36)),
                            *(undefined1 (*) [16])(pfVar18 + *(uint *)(uVar45 + 0xc + lVar36)));
    auVar69 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar16 + *(uint *)(uVar45 + 4 + lVar36)),
                            *(undefined1 (*) [16])(pfVar18 + *(uint *)(uVar45 + 0xc + lVar36)));
    auVar65 = vunpcklps_avx(auVar50,auVar69);
    auVar53 = vunpcklps_avx(auVar48,auVar49);
    auVar69 = vunpckhps_avx(auVar48,auVar49);
    auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar45 + 0x10 + lVar36)),
                            *(undefined1 (*) [16])(pfVar17 + *(uint *)(uVar45 + 0x18 + lVar36)));
    auVar50 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar45 + 0x10 + lVar36)),
                            *(undefined1 (*) [16])(pfVar17 + *(uint *)(uVar45 + 0x18 + lVar36)));
    auVar51 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar16 + *(uint *)(uVar45 + 0x14 + lVar36)),
                            *(undefined1 (*) [16])(pfVar18 + *(uint *)(uVar45 + 0x1c + lVar36)));
    auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar16 + *(uint *)(uVar45 + 0x14 + lVar36)),
                            *(undefined1 (*) [16])(pfVar18 + *(uint *)(uVar45 + 0x1c + lVar36)));
    auVar55 = vunpcklps_avx(auVar50,auVar48);
    auVar54 = vunpcklps_avx(auVar49,auVar51);
    auVar48 = vunpckhps_avx(auVar49,auVar51);
    auVar51 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar45 + 0x20 + lVar36)),
                            *(undefined1 (*) [16])(pfVar17 + *(uint *)(uVar45 + 0x28 + lVar36)));
    auVar50 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar15 + *(uint *)(uVar45 + 0x20 + lVar36)),
                            *(undefined1 (*) [16])(pfVar17 + *(uint *)(uVar45 + 0x28 + lVar36)));
    auVar52 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar16 + *(uint *)(uVar45 + 0x24 + lVar36)),
                            *(undefined1 (*) [16])(pfVar18 + *(uint *)(uVar45 + 0x2c + lVar36)));
    auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar16 + *(uint *)(uVar45 + 0x24 + lVar36)),
                            *(undefined1 (*) [16])(pfVar18 + *(uint *)(uVar45 + 0x2c + lVar36)));
    auVar57 = vunpcklps_avx(auVar50,auVar49);
    auVar56 = vunpcklps_avx(auVar51,auVar52);
    auVar49 = vunpckhps_avx(auVar51,auVar52);
    puVar5 = (undefined8 *)(uVar45 + 0x30 + lVar36);
    local_23c8 = *puVar5;
    uStack_23c0 = puVar5[1];
    puVar5 = (undefined8 *)(uVar45 + 0x40 + lVar36);
    local_2518 = *puVar5;
    uStack_2510 = puVar5[1];
    uVar87 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar58._4_4_ = uVar87;
    auVar58._0_4_ = uVar87;
    auVar58._8_4_ = uVar87;
    auVar58._12_4_ = uVar87;
    uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar59._4_4_ = uVar87;
    auVar59._0_4_ = uVar87;
    auVar59._8_4_ = uVar87;
    auVar59._12_4_ = uVar87;
    auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    uVar87 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar92._4_4_ = uVar87;
    auVar92._0_4_ = uVar87;
    auVar92._8_4_ = uVar87;
    auVar92._12_4_ = uVar87;
    uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar94._4_4_ = uVar87;
    auVar94._0_4_ = uVar87;
    auVar94._8_4_ = uVar87;
    auVar94._12_4_ = uVar87;
    mapUV = (UVIdentity<4>)0x0;
    fVar80 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar95._4_4_ = fVar80;
    auVar95._0_4_ = fVar80;
    auVar95._8_4_ = fVar80;
    auVar95._12_4_ = fVar80;
    auVar50 = vsubps_avx(auVar53,auVar58);
    auVar69 = vsubps_avx(auVar69,auVar59);
    auVar52 = vsubps_avx512vl(auVar65,auVar51);
    auVar53 = vsubps_avx512vl(auVar54,auVar58);
    auVar54 = vsubps_avx512vl(auVar48,auVar59);
    auVar55 = vsubps_avx512vl(auVar55,auVar51);
    auVar48 = vsubps_avx(auVar56,auVar58);
    auVar56 = vsubps_avx512vl(auVar49,auVar59);
    auVar51 = vsubps_avx512vl(auVar57,auVar51);
    auVar49 = vsubps_avx(auVar48,auVar50);
    auVar57 = vsubps_avx512vl(auVar56,auVar69);
    auVar58 = vsubps_avx512vl(auVar51,auVar52);
    auVar59 = vsubps_avx512vl(auVar50,auVar53);
    auVar60 = vsubps_avx512vl(auVar69,auVar54);
    auVar61 = vsubps_avx512vl(auVar52,auVar55);
    auVar62 = vsubps_avx512vl(auVar53,auVar48);
    auVar63 = vsubps_avx512vl(auVar54,auVar56);
    auVar64 = vsubps_avx512vl(auVar55,auVar51);
    auVar68._0_4_ = auVar48._0_4_ + auVar50._0_4_;
    auVar68._4_4_ = auVar48._4_4_ + auVar50._4_4_;
    auVar68._8_4_ = auVar48._8_4_ + auVar50._8_4_;
    auVar68._12_4_ = auVar48._12_4_ + auVar50._12_4_;
    auVar65 = vaddps_avx512vl(auVar56,auVar69);
    auVar66 = vaddps_avx512vl(auVar51,auVar52);
    auVar67 = vmulps_avx512vl(auVar65,auVar58);
    auVar67 = vfmsub231ps_avx512vl(auVar67,auVar57,auVar66);
    auVar66 = vmulps_avx512vl(auVar66,auVar49);
    auVar66 = vfmsub231ps_avx512vl(auVar66,auVar58,auVar68);
    auVar90._0_4_ = auVar57._0_4_ * auVar68._0_4_;
    auVar90._4_4_ = auVar57._4_4_ * auVar68._4_4_;
    auVar90._8_4_ = auVar57._8_4_ * auVar68._8_4_;
    auVar90._12_4_ = auVar57._12_4_ * auVar68._12_4_;
    auVar65 = vfmsub231ps_fma(auVar90,auVar49,auVar65);
    auVar91._0_4_ = fVar80 * auVar65._0_4_;
    auVar91._4_4_ = fVar80 * auVar65._4_4_;
    auVar91._8_4_ = fVar80 * auVar65._8_4_;
    auVar91._12_4_ = fVar80 * auVar65._12_4_;
    auVar65 = vfmadd231ps_avx512vl(auVar91,auVar94,auVar66);
    local_2508 = vfmadd231ps_avx512vl(auVar65,auVar92,auVar67);
    auVar65 = vaddps_avx512vl(auVar50,auVar53);
    auVar66 = vaddps_avx512vl(auVar69,auVar54);
    auVar67 = vaddps_avx512vl(auVar52,auVar55);
    auVar68 = vmulps_avx512vl(auVar66,auVar61);
    auVar68 = vfmsub231ps_avx512vl(auVar68,auVar60,auVar67);
    auVar67 = vmulps_avx512vl(auVar67,auVar59);
    auVar67 = vfmsub231ps_avx512vl(auVar67,auVar61,auVar65);
    auVar65 = vmulps_avx512vl(auVar65,auVar60);
    auVar65 = vfmsub231ps_avx512vl(auVar65,auVar59,auVar66);
    auVar66._0_4_ = fVar80 * auVar65._0_4_;
    auVar66._4_4_ = fVar80 * auVar65._4_4_;
    auVar66._8_4_ = fVar80 * auVar65._8_4_;
    auVar66._12_4_ = fVar80 * auVar65._12_4_;
    auVar65 = vfmadd231ps_avx512vl(auVar66,auVar94,auVar67);
    local_24f8 = vfmadd231ps_avx512vl(auVar65,auVar92,auVar68);
    auVar48 = vaddps_avx512vl(auVar53,auVar48);
    auVar65 = vaddps_avx512vl(auVar54,auVar56);
    auVar53 = vaddps_avx512vl(auVar55,auVar51);
    auVar51 = vmulps_avx512vl(auVar65,auVar64);
    auVar51 = vfmsub231ps_avx512vl(auVar51,auVar63,auVar53);
    auVar53 = vmulps_avx512vl(auVar53,auVar62);
    auVar53 = vfmsub231ps_avx512vl(auVar53,auVar64,auVar48);
    auVar55._0_4_ = auVar48._0_4_ * auVar63._0_4_;
    auVar55._4_4_ = auVar48._4_4_ * auVar63._4_4_;
    auVar55._8_4_ = auVar48._8_4_ * auVar63._8_4_;
    auVar55._12_4_ = auVar48._12_4_ * auVar63._12_4_;
    auVar48 = vfmsub231ps_avx512vl(auVar55,auVar62,auVar65);
    auVar48 = vmulps_avx512vl(auVar95,auVar48);
    auVar48 = vfmadd231ps_avx512vl(auVar48,auVar94,auVar53);
    auVar48 = vfmadd231ps_avx512vl(auVar48,auVar92,auVar51);
    auVar54._0_4_ = local_24f8._0_4_ + local_2508._0_4_;
    auVar54._4_4_ = local_24f8._4_4_ + local_2508._4_4_;
    auVar54._8_4_ = local_24f8._8_4_ + local_2508._8_4_;
    auVar54._12_4_ = local_24f8._12_4_ + local_2508._12_4_;
    local_24e8 = vaddps_avx512vl(auVar48,auVar54);
    auVar53._8_4_ = 0x7fffffff;
    auVar53._0_8_ = 0x7fffffff7fffffff;
    auVar53._12_4_ = 0x7fffffff;
    auVar65 = vandps_avx512vl(local_24e8,auVar53);
    auVar51._8_4_ = 0x34000000;
    auVar51._0_8_ = 0x3400000034000000;
    auVar51._12_4_ = 0x34000000;
    auVar53 = vmulps_avx512vl(auVar65,auVar51);
    auVar51 = vminps_avx512vl(local_2508,local_24f8);
    auVar51 = vminps_avx512vl(auVar51,auVar48);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar55 = vxorps_avx512vl(auVar53,auVar55);
    uVar29 = vcmpps_avx512vl(auVar51,auVar55,5);
    auVar51 = vmaxps_avx512vl(local_2508,local_24f8);
    auVar48 = vmaxps_avx512vl(auVar51,auVar48);
    uVar26 = vcmpps_avx512vl(auVar48,auVar53,2);
    bVar38 = ((byte)uVar29 | (byte)uVar26) & 0xf;
    if (bVar38 != 0) {
      auVar48 = vmulps_avx512vl(auVar58,auVar60);
      auVar53 = vmulps_avx512vl(auVar49,auVar61);
      auVar51 = vmulps_avx512vl(auVar57,auVar59);
      auVar55 = vmulps_avx512vl(auVar61,auVar63);
      auVar54 = vmulps_avx512vl(auVar59,auVar64);
      auVar56 = vmulps_avx512vl(auVar60,auVar62);
      auVar57 = vfmsub213ps_avx512vl(auVar57,auVar61,auVar48);
      auVar58 = vfmsub213ps_avx512vl(auVar58,auVar59,auVar53);
      auVar49 = vfmsub213ps_avx512vl(auVar49,auVar60,auVar51);
      auVar60 = vfmsub213ps_avx512vl(auVar64,auVar60,auVar55);
      auVar61 = vfmsub213ps_avx512vl(auVar62,auVar61,auVar54);
      auVar59 = vfmsub213ps_avx512vl(auVar63,auVar59,auVar56);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar48 = vandps_avx512vl(auVar48,auVar62);
      auVar55 = vandps_avx512vl(auVar55,auVar62);
      uVar37 = vcmpps_avx512vl(auVar48,auVar55,1);
      auVar48 = vandps_avx512vl(auVar53,auVar62);
      auVar53 = vandps_avx512vl(auVar54,auVar62);
      uVar47 = vcmpps_avx512vl(auVar48,auVar53,1);
      auVar48 = vandps_avx512vl(auVar51,auVar62);
      auVar53 = vandps_avx512vl(auVar56,auVar62);
      uVar27 = vcmpps_avx512vl(auVar48,auVar53,1);
      bVar46 = (bool)((byte)uVar37 & 1);
      local_2498._0_4_ = (uint)bVar46 * auVar57._0_4_ | (uint)!bVar46 * auVar60._0_4_;
      bVar46 = (bool)((byte)(uVar37 >> 1) & 1);
      local_2498._4_4_ = (uint)bVar46 * auVar57._4_4_ | (uint)!bVar46 * auVar60._4_4_;
      bVar46 = (bool)((byte)(uVar37 >> 2) & 1);
      local_2498._8_4_ = (uint)bVar46 * auVar57._8_4_ | (uint)!bVar46 * auVar60._8_4_;
      bVar46 = (bool)((byte)(uVar37 >> 3) & 1);
      local_2498._12_4_ = (uint)bVar46 * auVar57._12_4_ | (uint)!bVar46 * auVar60._12_4_;
      bVar46 = (bool)((byte)uVar47 & 1);
      local_2488._0_4_ = (uint)bVar46 * auVar58._0_4_ | (uint)!bVar46 * auVar61._0_4_;
      bVar46 = (bool)((byte)(uVar47 >> 1) & 1);
      local_2488._4_4_ = (uint)bVar46 * auVar58._4_4_ | (uint)!bVar46 * auVar61._4_4_;
      bVar46 = (bool)((byte)(uVar47 >> 2) & 1);
      local_2488._8_4_ = (uint)bVar46 * auVar58._8_4_ | (uint)!bVar46 * auVar61._8_4_;
      bVar46 = (bool)((byte)(uVar47 >> 3) & 1);
      local_2488._12_4_ = (uint)bVar46 * auVar58._12_4_ | (uint)!bVar46 * auVar61._12_4_;
      bVar46 = (bool)((byte)uVar27 & 1);
      local_2478[0] = (float)((uint)bVar46 * auVar49._0_4_ | (uint)!bVar46 * auVar59._0_4_);
      bVar46 = (bool)((byte)(uVar27 >> 1) & 1);
      local_2478[1] = (float)((uint)bVar46 * auVar49._4_4_ | (uint)!bVar46 * auVar59._4_4_);
      bVar46 = (bool)((byte)(uVar27 >> 2) & 1);
      local_2478[2] = (float)((uint)bVar46 * auVar49._8_4_ | (uint)!bVar46 * auVar59._8_4_);
      bVar46 = (bool)((byte)(uVar27 >> 3) & 1);
      local_2478[3] = (float)((uint)bVar46 * auVar49._12_4_ | (uint)!bVar46 * auVar59._12_4_);
      auVar61._0_4_ = fVar80 * local_2478[0];
      auVar61._4_4_ = fVar80 * local_2478[1];
      auVar61._8_4_ = fVar80 * local_2478[2];
      auVar61._12_4_ = fVar80 * local_2478[3];
      auVar48 = vfmadd213ps_fma(auVar94,local_2488,auVar61);
      auVar48 = vfmadd213ps_fma(auVar92,local_2498,auVar48);
      auVar56._0_4_ = auVar48._0_4_ + auVar48._0_4_;
      auVar56._4_4_ = auVar48._4_4_ + auVar48._4_4_;
      auVar56._8_4_ = auVar48._8_4_ + auVar48._8_4_;
      auVar56._12_4_ = auVar48._12_4_ + auVar48._12_4_;
      auVar60._0_4_ = auVar52._0_4_ * local_2478[0];
      auVar60._4_4_ = auVar52._4_4_ * local_2478[1];
      auVar60._8_4_ = auVar52._8_4_ * local_2478[2];
      auVar60._12_4_ = auVar52._12_4_ * local_2478[3];
      auVar69 = vfmadd213ps_fma(auVar69,local_2488,auVar60);
      auVar69 = vfmadd213ps_fma(auVar50,local_2498,auVar69);
      auVar48 = vrcp14ps_avx512vl(auVar56);
      auVar50._8_4_ = 0x3f800000;
      auVar50._0_8_ = 0x3f8000003f800000;
      auVar50._12_4_ = 0x3f800000;
      auVar50 = vfnmadd213ps_avx512vl(auVar48,auVar56,auVar50);
      auVar50 = vfmadd132ps_fma(auVar50,auVar48,auVar48);
      local_24a8._0_4_ = (auVar69._0_4_ + auVar69._0_4_) * auVar50._0_4_;
      local_24a8._4_4_ = (auVar69._4_4_ + auVar69._4_4_) * auVar50._4_4_;
      local_24a8._8_4_ = (auVar69._8_4_ + auVar69._8_4_) * auVar50._8_4_;
      local_24a8._12_4_ = (auVar69._12_4_ + auVar69._12_4_) * auVar50._12_4_;
      auVar83 = ZEXT1664(local_24a8);
      uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar69._4_4_ = uVar87;
      auVar69._0_4_ = uVar87;
      auVar69._8_4_ = uVar87;
      auVar69._12_4_ = uVar87;
      uVar29 = vcmpps_avx512vl(local_24a8,auVar69,0xd);
      uVar37 = CONCAT44(auVar56._4_4_,auVar56._0_4_);
      auVar57._0_8_ = uVar37 ^ 0x8000000080000000;
      auVar57._8_4_ = -auVar56._8_4_;
      auVar57._12_4_ = -auVar56._12_4_;
      fVar80 = (ray->super_RayK<1>).tfar;
      auVar52._4_4_ = fVar80;
      auVar52._0_4_ = fVar80;
      auVar52._8_4_ = fVar80;
      auVar52._12_4_ = fVar80;
      uVar26 = vcmpps_avx512vl(local_24a8,auVar52,2);
      uVar28 = vcmpps_avx512vl(auVar56,auVar57,4);
      bVar38 = (byte)uVar29 & (byte)uVar26 & (byte)uVar28 & bVar38;
      if (bVar38 != 0) {
        auVar62._0_4_ = (ray->super_RayK<1>).tfar;
        auVar62._4_4_ = (ray->super_RayK<1>).mask;
        auVar62._8_4_ = (ray->super_RayK<1>).id;
        auVar62._12_4_ = (ray->super_RayK<1>).flags;
        auVar96 = ZEXT1664(auVar62);
        uVar34 = vextractps_avx(auVar62,1);
        local_24d8 = &mapUV;
        local_24d0 = bVar38;
        uVar37 = vcmpps_avx512vl(auVar65,auVar100._0_16_,5);
        auVar69 = vrcp14ps_avx512vl(local_24e8);
        auVar85._8_4_ = 0x3f800000;
        auVar85._0_8_ = 0x3f8000003f800000;
        auVar85._12_4_ = 0x3f800000;
        auVar50 = vfnmadd213ps_fma(local_24e8,auVar69,auVar85);
        auVar50 = vfmadd132ps_avx512vl(auVar50,auVar69,auVar69);
        fVar1 = (float)((uint)((byte)uVar37 & 1) * auVar50._0_4_);
        fVar80 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar50._4_4_);
        fVar2 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar50._8_4_);
        fVar3 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar50._12_4_);
        auVar64._0_4_ = fVar1 * local_2508._0_4_;
        auVar64._4_4_ = fVar80 * local_2508._4_4_;
        auVar64._8_4_ = fVar2 * local_2508._8_4_;
        auVar64._12_4_ = fVar3 * local_2508._12_4_;
        local_24c8 = vminps_avx(auVar64,auVar85);
        auVar67._0_4_ = fVar1 * local_24f8._0_4_;
        auVar67._4_4_ = fVar80 * local_24f8._4_4_;
        auVar67._8_4_ = fVar2 * local_24f8._8_4_;
        auVar67._12_4_ = fVar3 * local_24f8._12_4_;
        local_24b8 = vminps_avx(auVar67,auVar85);
        auVar81._8_4_ = 0x7f800000;
        auVar81._0_8_ = 0x7f8000007f800000;
        auVar81._12_4_ = 0x7f800000;
        auVar50 = vblendmps_avx512vl(auVar81,local_24a8);
        auVar63._0_4_ = (uint)(bVar38 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar38 & 1) * 0x7f800000;
        bVar46 = (bool)(bVar38 >> 1 & 1);
        auVar63._4_4_ = (uint)bVar46 * auVar50._4_4_ | (uint)!bVar46 * 0x7f800000;
        bVar46 = (bool)(bVar38 >> 2 & 1);
        auVar63._8_4_ = (uint)bVar46 * auVar50._8_4_ | (uint)!bVar46 * 0x7f800000;
        auVar63._12_4_ =
             (uint)(bVar38 >> 3) * auVar50._12_4_ | (uint)!(bool)(bVar38 >> 3) * 0x7f800000;
        auVar50 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar50 = vminps_avx(auVar50,auVar63);
        auVar69 = vshufpd_avx(auVar50,auVar50,1);
        auVar50 = vminps_avx(auVar69,auVar50);
        uVar29 = vcmpps_avx512vl(auVar63,auVar50,0);
        bVar39 = (byte)uVar29 & bVar38;
        do {
          bVar30 = bVar38;
          if (bVar39 != 0) {
            bVar30 = bVar39;
          }
          uVar31 = 0;
          for (uVar41 = (uint)bVar30; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x80000000) {
            uVar31 = uVar31 + 1;
          }
          uVar41 = uVar31 & 0xff;
          h.geomID = *(uint *)((long)&local_23c8 + (ulong)uVar41 * 4);
          pGVar19 = (local_25a0->geometries).items[h.geomID].ptr;
          if ((pGVar19->mask & uVar34) == 0) {
            bVar38 = ~(byte)(1 << (uVar31 & 0x1f)) & bVar38;
          }
          else {
            pRVar20 = context->args;
            if (pRVar20->filter == (RTCFilterFunctionN)0x0) {
              args.context = context->user;
              if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar37 = (ulong)(uVar41 << 2);
                fVar80 = *(float *)(local_24c8 + uVar37);
                fVar2 = *(float *)(local_24b8 + uVar37);
                (ray->super_RayK<1>).tfar = *(float *)(local_24a8 + uVar37);
                (ray->Ng).field_0.field_0.x = *(float *)(local_2498 + uVar37);
                (ray->Ng).field_0.field_0.y = *(float *)(local_2488 + uVar37);
                (ray->Ng).field_0.field_0.z = *(float *)((long)local_2478 + uVar37);
                ray->u = fVar80;
                ray->v = fVar2;
                ray->primID = *(uint *)((long)&local_2518 + uVar37);
                ray->geomID = h.geomID;
                ray->instID[0] = (args.context)->instID[0];
                ray->instPrimID[0] = (args.context)->instPrimID[0];
                break;
              }
            }
            else {
              args.context = context->user;
            }
            uVar37 = (ulong)(uVar41 * 4);
            h.Ng.field_0.field_0.x = *(float *)(local_2498 + uVar37);
            h.Ng.field_0.field_0.y = *(float *)(local_2488 + uVar37);
            h.Ng.field_0.field_0.z = *(float *)((long)local_2478 + uVar37);
            h.u = *(float *)(local_24c8 + uVar37);
            h.v = *(float *)(local_24b8 + uVar37);
            h.primID = *(uint *)((long)&local_2518 + uVar37);
            h.instID[0] = (args.context)->instID[0];
            h.instPrimID[0] = (args.context)->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_24a8 + uVar37);
            local_25c4 = -1;
            args.valid = &local_25c4;
            args.geometryUserPtr = pGVar19->userPtr;
            args.ray = (RTCRayN *)ray;
            args.hit = (RTCHitN *)&h;
            args.N = 1;
            auVar50 = auVar83._0_16_;
            if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c75044:
              if ((pRVar20->filter != (RTCFilterFunctionN)0x0) &&
                 (((pRVar20->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar19->field_8).field_0x2 & 0x40) != 0))))
              {
                (*pRVar20->filter)(&args);
                auVar83 = ZEXT1664(auVar50);
                auVar105 = ZEXT3264(local_2468);
                auVar104 = ZEXT3264(local_2448);
                auVar103 = ZEXT3264(local_2428);
                auVar102 = ZEXT3264(local_2408);
                auVar101 = ZEXT3264(local_23e8);
                auVar69 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar100 = ZEXT1664(auVar69);
                if (*args.valid == 0) goto LAB_01c75139;
              }
              *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
              *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
              *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
              *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
              *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
              *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
              *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
              *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
              *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
            }
            else {
              (*pGVar19->intersectionFilterN)(&args);
              auVar83 = ZEXT1664(auVar50);
              auVar105 = ZEXT3264(local_2468);
              auVar104 = ZEXT3264(local_2448);
              auVar103 = ZEXT3264(local_2428);
              auVar102 = ZEXT3264(local_2408);
              auVar101 = ZEXT3264(local_23e8);
              auVar69 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar100 = ZEXT1664(auVar69);
              if (*args.valid != 0) goto LAB_01c75044;
LAB_01c75139:
              auVar83 = ZEXT1664(auVar50);
              local_2538 = auVar96._0_4_;
              (ray->super_RayK<1>).tfar = local_2538;
            }
            auVar7._0_4_ = (ray->super_RayK<1>).tfar;
            auVar7._4_4_ = (ray->super_RayK<1>).mask;
            auVar7._8_4_ = (ray->super_RayK<1>).id;
            auVar7._12_4_ = (ray->super_RayK<1>).flags;
            auVar96 = ZEXT1664(auVar7);
            fVar80 = (ray->super_RayK<1>).tfar;
            auVar32._4_4_ = fVar80;
            auVar32._0_4_ = fVar80;
            auVar32._8_4_ = fVar80;
            auVar32._12_4_ = fVar80;
            uVar29 = vcmpps_avx512vl(auVar83._0_16_,auVar32,2);
            bVar38 = ~(byte)(1 << (uVar31 & 0x1f)) & bVar38 & (byte)uVar29;
            uVar34 = vextractps_avx(auVar7,1);
          }
          if (bVar38 == 0) break;
          auVar82._8_4_ = 0x7f800000;
          auVar82._0_8_ = 0x7f8000007f800000;
          auVar82._12_4_ = 0x7f800000;
          auVar50 = vblendmps_avx512vl(auVar82,auVar83._0_16_);
          auVar70._0_4_ =
               (uint)(bVar38 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar38 & 1) * 0x7f800000;
          bVar46 = (bool)(bVar38 >> 1 & 1);
          auVar70._4_4_ = (uint)bVar46 * auVar50._4_4_ | (uint)!bVar46 * 0x7f800000;
          bVar46 = (bool)(bVar38 >> 2 & 1);
          auVar70._8_4_ = (uint)bVar46 * auVar50._8_4_ | (uint)!bVar46 * 0x7f800000;
          auVar70._12_4_ =
               (uint)(bVar38 >> 3) * auVar50._12_4_ | (uint)!(bool)(bVar38 >> 3) * 0x7f800000;
          auVar50 = vshufps_avx(auVar70,auVar70,0xb1);
          auVar50 = vminps_avx(auVar50,auVar70);
          auVar69 = vshufpd_avx(auVar50,auVar50,1);
          auVar50 = vminps_avx(auVar69,auVar50);
          uVar29 = vcmpps_avx512vl(auVar70,auVar50,0);
          bVar39 = (byte)uVar29 & bVar38;
        } while( true );
      }
    }
    auVar96 = ZEXT3264(local_2398);
    auVar97 = ZEXT3264(local_23b8);
    uVar37 = local_25b8;
  }
  fVar80 = (ray->super_RayK<1>).tfar;
  auVar83 = ZEXT3264(CONCAT428(fVar80,CONCAT424(fVar80,CONCAT420(fVar80,CONCAT416(fVar80,CONCAT412(
                                                  fVar80,CONCAT48(fVar80,CONCAT44(fVar80,fVar80)))))
                                               )));
  auVar71 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar98 = ZEXT3264(auVar71);
  auVar99 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  goto LAB_01c744e3;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }